

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O2

QStatusBar * __thiscall QMainWindow::statusBar(QMainWindow *this)

{
  QWidget *this_00;
  QMainWindow *self;
  
  this_00 = &QMainWindowLayout::statusBar
                       (*(QMainWindowLayout **)(*(long *)&(this->super_QWidget).field_0x8 + 0x260))
             ->super_QWidget;
  if (this_00 == (QWidget *)0x0) {
    this_00 = (QWidget *)operator_new(0x28);
    QStatusBar::QStatusBar((QStatusBar *)this_00,&this->super_QWidget);
    QWidget::setSizePolicy(this_00,(QSizePolicy)0xd0000);
    setStatusBar(this,(QStatusBar *)this_00);
  }
  return (QStatusBar *)this_00;
}

Assistant:

QStatusBar *QMainWindow::statusBar() const
{
    QStatusBar *statusbar = d_func()->layout->statusBar();
    if (!statusbar) {
        QMainWindow *self = const_cast<QMainWindow *>(this);
        statusbar = new QStatusBar(self);
        statusbar->setSizePolicy(QSizePolicy::Ignored, QSizePolicy::Fixed);
        self->setStatusBar(statusbar);
    }
    return statusbar;
}